

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O1

void __thiscall
duckdb::ReservoirSample::UpdateSampleAppend
          (ReservoirSample *this,DataChunk *this_,DataChunk *other,SelectionVector *other_sel,
          idx_t append_count)

{
  idx_t iVar1;
  bool bVar2;
  DataChunk *this_00;
  pointer pRVar3;
  reference other_00;
  reference source_p;
  reference target;
  ulong __n;
  vector<duckdb::LogicalType,_true> types;
  value_type col_type;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  LogicalType local_48;
  
  if (other->count != 0) {
    iVar1 = this_->count;
    this_00 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
               ::operator->(&this->reservoir_chunk)->chunk;
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_60,this_00);
    __n = 0;
    while( true ) {
      pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
               ::operator->(&this->reservoir_chunk);
      if ((ulong)(((long)(pRVar3->chunk).data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(pRVar3->chunk).data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) <= __n)
      break;
      other_00 = vector<duckdb::LogicalType,_true>::operator[]
                           ((vector<duckdb::LogicalType,_true> *)&local_60,__n);
      LogicalType::LogicalType(&local_48,other_00);
      bVar2 = LogicalType::IsNumeric(&local_48);
      if ((bVar2) || (this->stats_sample == false)) {
        source_p = vector<duckdb::Vector,_true>::operator[](&other->data,__n);
        target = vector<duckdb::Vector,_true>::operator[](&this_->data,__n);
        VectorOperations::Copy(source_p,target,other_sel,append_count,0,this_->count);
      }
      LogicalType::~LogicalType(&local_48);
      __n = __n + 1;
    }
    this_->count = iVar1 + append_count;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  }
  return;
}

Assistant:

void ReservoirSample::UpdateSampleAppend(DataChunk &this_, DataChunk &other, SelectionVector &other_sel,
                                         idx_t append_count) const {
	idx_t new_size = this_.size() + append_count;
	if (other.size() == 0) {
		return;
	}
	D_ASSERT(this_.GetTypes() == other.GetTypes());
	auto types = reservoir_chunk->chunk.GetTypes();

	for (idx_t i = 0; i < reservoir_chunk->chunk.ColumnCount(); i++) {
		auto col_type = types[i];
		if (ValidSampleType(col_type) || !stats_sample) {
			D_ASSERT(this_.data[i].GetVectorType() == VectorType::FLAT_VECTOR);
			VectorOperations::Copy(other.data[i], this_.data[i], other_sel, append_count, 0, this_.size());
		}
	}
	this_.SetCardinality(new_size);
}